

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_kint(jit_State *J,int32_t k)

{
  ushort uVar1;
  IRIns *pIVar2;
  uint local_3c;
  IRRef ref;
  IRIns *cir;
  IRIns *ir;
  int32_t k_local;
  jit_State *J_local;
  IRRef ref_1;
  
  pIVar2 = (J->cur).ir;
  uVar1 = J->chain[0x17];
  while (local_3c = (uint)uVar1, local_3c != 0) {
    if (pIVar2[local_3c].field_1.op12 == k) goto LAB_0013f1c0;
    uVar1 = *(ushort *)((long)pIVar2 + (ulong)local_3c * 8 + 6);
  }
  local_3c = (J->cur).nk;
  if (local_3c <= J->irbotlim) {
    lj_ir_growbot(J);
  }
  local_3c = local_3c - 1;
  (J->cur).nk = local_3c;
  pIVar2 = (J->cur).ir + local_3c;
  pIVar2->i = k;
  (pIVar2->field_1).t.irt = '\x13';
  (pIVar2->field_1).o = '\x17';
  (pIVar2->field_0).prev = J->chain[0x17];
  J->chain[0x17] = (IRRef1)local_3c;
LAB_0013f1c0:
  return local_3c + 0x13000000;
}

Assistant:

TRef LJ_FASTCALL lj_ir_kint(jit_State *J, int32_t k)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  for (ref = J->chain[IR_KINT]; ref; ref = cir[ref].prev)
    if (cir[ref].i == k)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->i = k;
  ir->t.irt = IRT_INT;
  ir->o = IR_KINT;
  ir->prev = J->chain[IR_KINT];
  J->chain[IR_KINT] = (IRRef1)ref;
found:
  return TREF(ref, IRT_INT);
}